

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

Int __thiscall Json::Value::asInt(Value *this)

{
  bool bVar1;
  double *in_RDI;
  ostringstream oss_4;
  ostringstream oss_3;
  long val;
  ostringstream oss_2;
  ostringstream oss_1;
  ostringstream oss;
  int in_stack_fffffffffffff768;
  int in_stack_fffffffffffff76c;
  long *in_stack_fffffffffffff770;
  ostringstream *poVar2;
  char *in_stack_fffffffffffff778;
  undefined7 in_stack_fffffffffffff780;
  byte in_stack_fffffffffffff787;
  string local_840 [8];
  Value *in_stack_fffffffffffff7c8;
  ostringstream local_820 [376];
  string local_6a8 [32];
  ostringstream local_688 [16];
  Value *in_stack_fffffffffffff988;
  string local_510 [32];
  long local_4f0;
  string local_4e8 [32];
  ostringstream local_4c8 [376];
  string local_350 [32];
  ostringstream local_330 [376];
  string local_1b8 [48];
  ostringstream local_188 [388];
  uint local_4;
  
  switch(*(undefined1 *)(in_RDI + 1)) {
  case 0:
    local_4 = 0;
    break;
  case 1:
  case 3:
    bVar1 = isInt(in_stack_fffffffffffff7c8);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_188);
      std::operator<<((ostream *)local_188,"LargestInt out of Int range");
      std::__cxx11::ostringstream::str();
      throwLogicError((string *)CONCAT17(in_stack_fffffffffffff787,in_stack_fffffffffffff780));
      std::__cxx11::string::~string(local_1b8);
      abort();
    }
    local_4 = SUB84(*in_RDI,0);
    break;
  case 2:
    bVar1 = isInt(in_stack_fffffffffffff7c8);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_330);
      std::operator<<((ostream *)local_330,"LargestUInt out of Int range");
      std::__cxx11::ostringstream::str();
      throwLogicError((string *)CONCAT17(in_stack_fffffffffffff787,in_stack_fffffffffffff780));
      std::__cxx11::string::~string(local_350);
      abort();
    }
    local_4 = SUB84(*in_RDI,0);
    break;
  case 4:
    bVar1 = InRange<int,int>((double)in_stack_fffffffffffff770,in_stack_fffffffffffff76c,
                             in_stack_fffffffffffff768);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_4c8);
      std::operator<<((ostream *)local_4c8,"double out of Int range");
      std::__cxx11::ostringstream::str();
      throwLogicError((string *)CONCAT17(in_stack_fffffffffffff787,in_stack_fffffffffffff780));
      std::__cxx11::string::~string(local_4e8);
      abort();
    }
    local_4 = (uint)*in_RDI;
    break;
  case 5:
    asString_abi_cxx11_(in_stack_fffffffffffff988);
    std::__cxx11::string::c_str();
    bVar1 = converToInt(in_stack_fffffffffffff778,in_stack_fffffffffffff770);
    in_stack_fffffffffffff787 = bVar1 ^ 0xff;
    std::__cxx11::string::~string(local_510);
    if ((in_stack_fffffffffffff787 & 1) != 0) goto switchD_00142685_default;
    bVar1 = IsInRange<long,int,int>(local_4f0,-0x80000000,0x7fffffff);
    if (!bVar1) {
      poVar2 = local_688;
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::operator<<((ostream *)poVar2,"LargestInt out of Int range");
      std::__cxx11::ostringstream::str();
      throwLogicError((string *)CONCAT17(in_stack_fffffffffffff787,in_stack_fffffffffffff780));
      std::__cxx11::string::~string(local_6a8);
      abort();
    }
    local_4 = (uint)local_4f0;
    break;
  case 6:
    local_4 = (uint)(((ulong)*in_RDI & 1) != 0);
    break;
  default:
switchD_00142685_default:
    poVar2 = local_820;
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::operator<<((ostream *)poVar2,"Value is not convertible to Int.");
    std::__cxx11::ostringstream::str();
    throwLogicError((string *)CONCAT17(in_stack_fffffffffffff787,in_stack_fffffffffffff780));
    std::__cxx11::string::~string(local_840);
    abort();
  }
  return local_4;
}

Assistant:

Value::Int Value::asInt() const {
  switch (type_) {
#if defined(JSON_HAS_INT64)
  case int64Value:
#endif
  case intValue:
    JSON_ASSERT_MESSAGE(isInt(), "LargestInt out of Int range");
    return Int(value_.int_);
  case uintValue:
    JSON_ASSERT_MESSAGE(isInt(), "LargestUInt out of Int range");
    return Int(value_.uint_);
  case realValue:
    JSON_ASSERT_MESSAGE(InRange(value_.real_, minInt, maxInt),
                        "double out of Int range");
    return Int(value_.real_);
  case nullValue:
    return 0;
  case booleanValue:
    return value_.bool_ ? 1 : 0;
  case stringValue: {
    long int val;

    if (!converToInt (asString().c_str(), &val)) {
      break;
    }

    JSON_ASSERT_MESSAGE(IsInRange (val, minInt, maxInt),
                        "LargestInt out of Int range");
    return Int(val);
  }
  default:
    break;
  }
  JSON_FAIL_MESSAGE("Value is not convertible to Int.");
}